

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Term.cpp
# Opt level: O2

uint __thiscall Kernel::Term::computeDistinctVars(Term *this)

{
  bool bVar1;
  Set<unsigned_int,_Lib::DefaultHash> vars;
  VariableIterator vit;
  Set<unsigned_int,_Lib::DefaultHash> SStack_88;
  VariableIterator local_60;
  
  Lib::Set<unsigned_int,_Lib::DefaultHash>::Set(&SStack_88);
  VariableIterator::VariableIterator(&local_60,this);
  while( true ) {
    bVar1 = VariableIterator::hasNext(&local_60);
    if (!bVar1) break;
    local_60._used = true;
    Lib::Set<unsigned_int,_Lib::DefaultHash>::insert
              (&SStack_88,(uint)(local_60._stack._cursor[-1]->_content >> 2));
  }
  VariableIterator::~VariableIterator(&local_60);
  Lib::Set<unsigned_int,_Lib::DefaultHash>::~Set(&SStack_88);
  return SStack_88._size;
}

Assistant:

unsigned Term::computeDistinctVars() const
{
  Set<unsigned> vars;
  VariableIterator vit(this);
  while (vit.hasNext()) {
    vars.insert(vit.next().var());
  }
  return vars.size();
}